

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFPageInput.cpp
# Opt level: O2

void __thiscall
PDFPageInput::PDFPageInput
          (PDFPageInput *this,PDFParser *inParser,RefCountPtr<PDFDictionary> *inPageObject)

{
  (this->mPageObject).super_RefCountPtr<PDFDictionary>.mValue = (PDFDictionary *)0x0;
  (this->mPageObject).super_RefCountPtr<PDFDictionary>._vptr_RefCountPtr =
       (_func_int **)&PTR__RefCountPtr_0036d8c0;
  this->mParser = inParser;
  PDFObjectCastPtr<PDFDictionary>::operator=
            (&this->mPageObject,&inPageObject->mValue->super_PDFObject);
  AssertPageObjectValid(this);
  return;
}

Assistant:

PDFPageInput::PDFPageInput(PDFParser* inParser,const RefCountPtr<PDFDictionary>& inPageObject)
{
    mParser = inParser;
    mPageObject = inPageObject.GetPtr();
    AssertPageObjectValid();
}